

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O2

void check_text(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int local_d0;
  int argc_local;
  SourceLineInfo local_c8;
  BinaryExpr<const_int_&,_const_int_&> local_b8;
  AssertionHandler catchAssertionHandler;
  StringRef local_40;
  
  local_b8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1703dc;
  local_b8.super_ITransientExpression.m_isBinaryExpression = true;
  local_b8.super_ITransientExpression.m_result = false;
  local_b8.super_ITransientExpression._10_6_ = 0;
  local_c8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
  ;
  local_c8.line = 0x34;
  argc_local = argc;
  Catch::StringRef::StringRef(&local_40,"argc == 1");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_b8,&local_c8,local_40,Normal);
  local_d0 = 1;
  local_c8.file = (char *)&argc_local;
  Catch::ExprLhs<int_const&>::operator==(&local_b8,(ExprLhs<int_const&> *)&local_c8,&local_d0);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_b8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_b8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  lVar2 = duckdb_shell_sqlite3_value_text(*argv);
  uVar1 = duckdb_shell_sqlite3_value_bytes(*argv);
  uVar3 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    *(undefined1 *)(lVar2 + uVar3) = 0x54;
  }
  duckdb_shell_sqlite3_result_text(context,lVar2,uVar1,0);
  return;
}

Assistant:

static void check_text(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE(argc == 1);
	char *str = (char *)sqlite3_value_text(argv[0]);
	int len = sqlite3_value_bytes(argv[0]);
	for (int i = 0; i < len; ++i) {
		str[i] = 'T';
	}
	sqlite3_result_text(context, str, len, nullptr);
}